

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O3

Sbd_Srv_t *
Sbd_ManCutServerStart
          (Gia_Man_t *pGia,Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,Vec_Int_t *vLevs,Vec_Int_t *vRefs
          ,int nLutSize,int nCutSize,int nCutNum,int fVerbose)

{
  int iVar1;
  Sbd_Srv_t *pSVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  abctime aVar5;
  timespec local_40;
  
  if (nCutSize < nLutSize) {
    __assert_fail("nLutSize <= nCutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                  ,0x59,
                  "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                 );
  }
  if (0xe < nCutSize) {
    __assert_fail("nCutSize < SBD_CUT_NO_LEAF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                  ,0x5a,
                  "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                 );
  }
  if (8 < nCutSize - 2U) {
    __assert_fail("nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                  ,0x5b,
                  "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                 );
  }
  if (nCutNum - 2U < 499) {
    pSVar2 = (Sbd_Srv_t *)calloc(1,0x8d48);
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      aVar5 = -1;
    }
    else {
      aVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    pSVar2->clkStart = aVar5;
    pSVar2->nLutSize = nLutSize;
    pSVar2->nCutSize = nCutSize;
    pSVar2->nCutNum = nCutNum;
    pSVar2->fVerbose = fVerbose;
    pSVar2->pGia = pGia;
    pSVar2->vMirrors = vMirrors;
    pSVar2->vLutLevs = vLutLevs;
    pSVar2->vLevs = vLevs;
    pSVar2->vRefs = vRefs;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    piVar4 = (int *)malloc(400);
    pVVar3->pArray = piVar4;
    pSVar2->vCut0 = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    piVar4 = (int *)malloc(400);
    pVVar3->pArray = piVar4;
    pSVar2->vCut = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    piVar4 = (int *)malloc(400);
    pVVar3->pArray = piVar4;
    pSVar2->vCutTop = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    piVar4 = (int *)malloc(400);
    pVVar3->pArray = piVar4;
    pSVar2->vCutBot = pVVar3;
    return pSVar2;
  }
  __assert_fail("nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                ,0x5c,
                "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
               );
}

Assistant:

Sbd_Srv_t * Sbd_ManCutServerStart( Gia_Man_t * pGia, Vec_Int_t * vMirrors, 
                                   Vec_Int_t * vLutLevs, Vec_Int_t * vLevs, Vec_Int_t * vRefs, 
                                   int nLutSize, int nCutSize, int nCutNum, int fVerbose )
{
    Sbd_Srv_t * p;
    assert( nLutSize <= nCutSize );
    assert( nCutSize < SBD_CUT_NO_LEAF );
    assert( nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE );
    assert( nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM );
    p = ABC_CALLOC( Sbd_Srv_t, 1 );
    p->clkStart = Abc_Clock();
    p->nLutSize = nLutSize;
    p->nCutSize = nCutSize;
    p->nCutNum  = nCutNum;
    p->fVerbose = fVerbose;
    p->pGia     = pGia;
    p->vMirrors = vMirrors;
    p->vLutLevs = vLutLevs;
    p->vLevs    = vLevs;
    p->vRefs    = vRefs;
    p->vCut0    = Vec_IntAlloc( 100 );
    p->vCut     = Vec_IntAlloc( 100 );
    p->vCutTop  = Vec_IntAlloc( 100 );
    p->vCutBot  = Vec_IntAlloc( 100 );
    return p;
}